

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O3

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," KeyPressed {",0xd);
  *(uint *)(usleep + *(long *)(std::cout + -0x18)) =
       *(uint *)(usleep + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(arg + 0x10));
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} || Character (",0x10);
  uStack_18 = CONCAT17(arg[0x14],(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (*(int *)(arg + 0x10) == 200) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"up key!\n",8);
  }
  return true;
}

Assistant:

bool keyPressed(const KeyEvent& arg)
	{
		std::cout << " KeyPressed {" << std::hex << arg.key << std::dec
				  << "} || Character (" << (char)arg.text << ")" << std::endl;

		if(arg.key == OIS::KeyCode::KC_UP)
		{
			std::cout << "up key!\n";
		}

		return true;
	}